

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathCastNodeSetToString(xmlNodeSetPtr ns)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlNodePtr *dst;
  
  if (ns != (xmlNodeSetPtr)0x0) {
    uVar1 = ns->nodeNr;
    if (((ulong)uVar1 != 0) && (dst = ns->nodeTab, dst != (xmlNodePtr *)0x0)) {
      if (1 < (int)uVar1) {
        libxml_domnode_tim_sort(dst,(ulong)uVar1);
        dst = ns->nodeTab;
      }
      pxVar2 = xmlNodeGetContent(*dst);
      return pxVar2;
    }
  }
  pxVar2 = xmlStrdup("");
  return pxVar2;
}

Assistant:

xmlChar *
xmlXPathCastNodeSetToString (xmlNodeSetPtr ns) {
    if ((ns == NULL) || (ns->nodeNr == 0) || (ns->nodeTab == NULL))
	return(xmlStrdup((const xmlChar *) ""));

    if (ns->nodeNr > 1)
	xmlXPathNodeSetSort(ns);
    return(xmlXPathCastNodeToString(ns->nodeTab[0]));
}